

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void get_token_start(AV1_COMP *cpi,TileInfo *tile_info,int tile_row,int tile_col,int mi_row,
                    TokenExtra **tp)

{
  int iVar1;
  undefined4 uVar2;
  long lVar3;
  _Bool _Var4;
  TokenInfo *token_info_00;
  int in_ECX;
  int in_EDX;
  AV1_COMP *in_RSI;
  long in_RDI;
  int in_R8D;
  TokenExtra **in_R9;
  int unaff_retaddr;
  int sb_row_in_tile;
  TokenList *tplist;
  int num_planes;
  AV1_COMMON *cm;
  TokenInfo *token_info;
  int sb_size_log2;
  
  token_info_00 = (TokenInfo *)(in_RDI + 0x71328);
  _Var4 = is_token_info_allocated(token_info_00);
  sb_size_log2 = (int)((ulong)token_info_00 >> 0x20);
  if (_Var4) {
    av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
    lVar3 = *(long *)(in_RDI + 0x79330 + (long)in_EDX * 0x200 + (long)in_ECX * 8);
    iVar1 = *(int *)&in_RSI->ppi;
    uVar2 = *(undefined4 *)(*(long *)(in_RDI + 0x42008) + 0x24);
    get_start_tok(in_RSI,in_EDX,in_ECX,in_R8D,in_R9,sb_size_log2,unaff_retaddr);
    *(TokenExtra **)(lVar3 + (long)(in_R8D - iVar1 >> ((byte)uVar2 & 0x1f)) * 0x10) = *in_R9;
  }
  return;
}

Assistant:

static inline void get_token_start(AV1_COMP *cpi, const TileInfo *tile_info,
                                   int tile_row, int tile_col, int mi_row,
                                   TokenExtra **tp) {
  const TokenInfo *token_info = &cpi->token_info;
  if (!is_token_info_allocated(token_info)) return;

  const AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  TokenList *const tplist = cpi->token_info.tplist[tile_row][tile_col];
  const int sb_row_in_tile =
      (mi_row - tile_info->mi_row_start) >> cm->seq_params->mib_size_log2;

  get_start_tok(cpi, tile_row, tile_col, mi_row, tp,
                cm->seq_params->mib_size_log2 + MI_SIZE_LOG2, num_planes);
  assert(tplist != NULL);
  tplist[sb_row_in_tile].start = *tp;
}